

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1_LoadImageDataTest_LoadImageDataExternal_Test::TestBody
          (ktxTexture1_LoadImageDataTest_LoadImageDataExternal_Test *this)

{
  bool bVar1;
  undefined8 uVar2;
  char *rhs_expression;
  AssertHelper *this_00;
  AssertHelper *this_01;
  long in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_uint8_t *buf;
  ktx_error_code_e result;
  ktxTexture *texture;
  char (*in_stack_fffffffffffffe88) [37];
  AssertionResult *in_stack_fffffffffffffe90;
  bool *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  int line;
  Message *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  Type type;
  AssertHelper *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffef0;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffef8;
  ktx_uint8_t *in_stack_ffffffffffffff00;
  TextureWriterTestHelper<unsigned_char,_4U,_32856U> *in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertionResult local_e8 [2];
  undefined4 local_c8;
  undefined4 local_c4;
  AssertionResult local_c0;
  uint local_ac;
  string local_a8 [40];
  undefined8 local_80;
  undefined1 local_69;
  AssertionResult local_68 [3];
  undefined4 local_34;
  AssertionResult local_30;
  void *local_20;
  undefined4 local_14;
  long local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_10[0] = 0;
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    local_14 = ktxTexture_CreateFromMemory
                         (*(undefined8 *)(in_RDI + 0x1a0),*(undefined8 *)(in_RDI + 0x1a8),0,local_10
                         );
    local_34 = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               (ktx_error_code_e *)in_stack_fffffffffffffe98,
               (ktx_error_code_e *)in_stack_fffffffffffffe90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffec0);
      testing::AssertionResult::failure_message((AssertionResult *)0x13b389);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffec0,type,(char *)in_stack_fffffffffffffeb0,
                 (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
      testing::Message::~Message((Message *)0x13b3e6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b454);
    local_69 = local_10[0] != 0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffe90,(bool *)in_stack_fffffffffffffe88,(type *)0x13b482);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_68);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffec0 =
           (AssertHelper *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      uVar2 = ktxErrorString(local_14);
      local_80 = uVar2;
      in_stack_fffffffffffffeb0 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffe90,(char **)in_stack_fffffffffffffe88);
      type = (Type)((ulong)uVar2 >> 0x20);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                 (char *)in_stack_fffffffffffffef8._M_head_impl,in_stack_fffffffffffffef0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffec0,type,(char *)in_stack_fffffffffffffeb0,
                 (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
      std::__cxx11::string::~string(local_a8);
      testing::Message::~Message((Message *)0x13b5a6);
    }
    local_ac = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b653);
    if (local_ac == 0) {
      local_20 = operator_new__(*(ulong *)(in_RDI + 0x1c0));
      local_c4 = (**(code **)(*(long *)(local_10[0] + 8) + 0x40))
                           (local_10[0],local_20,*(undefined8 *)(in_RDI + 0x1c0));
      local_c8 = 0;
      testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                 (ktx_error_code_e *)in_stack_fffffffffffffe98,
                 (ktx_error_code_e *)in_stack_fffffffffffffe90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffec0);
        in_stack_fffffffffffffea8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x13b72f);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffec0,type,(char *)in_stack_fffffffffffffeb0,
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
        testing::Message::~Message((Message *)0x13b78c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b7fa);
      rhs_expression = (char *)(in_RDI + 0x1c0);
      this_00 = (AssertHelper *)ktxTexture_GetDataSize(local_10[0]);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                (in_stack_fffffffffffffea8,rhs_expression,(unsigned_long *)in_stack_fffffffffffffe98
                 ,(unsigned_long *)in_stack_fffffffffffffe90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffec0);
        in_stack_fffffffffffffe98 =
             (bool *)testing::AssertionResult::failure_message((AssertionResult *)0x13b88d);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffec0,type,(char *)in_stack_fffffffffffffeb0,
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),rhs_expression);
        testing::internal::AssertHelper::operator=(this_00,(Message *)in_stack_ffffffffffffff08);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
        testing::Message::~Message((Message *)0x13b8e1);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b94c);
      TextureWriterTestHelper<unsigned_char,_4U,_32856U>::compareTexture1Images
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffea8,rhs_expression,in_stack_fffffffffffffe98,
                 &in_stack_fffffffffffffe90->success_);
      line = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffef0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffec0);
        this_01 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0x13b9cc);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffec0,type,(char *)in_stack_fffffffffffffeb0,line,
                   rhs_expression);
        testing::internal::AssertHelper::operator=(this_00,(Message *)in_stack_ffffffffffffff08);
        testing::internal::AssertHelper::~AssertHelper(this_01);
        testing::Message::~Message((Message *)0x13ba1a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ba7c);
      if (local_10[0] != 0) {
        (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
      }
      if (local_20 != (void *)0x0) {
        operator_delete__(local_20);
      }
    }
  }
  return;
}

Assistant:

TEST_F(ktxTexture1_LoadImageDataTest, LoadImageDataExternal) {
    ktxTexture* texture = 0;
    KTX_error_code result;
    ktx_uint8_t* buf;

    if (ktxMemFile != NULL) {
        result = ktxTexture_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                             0,
                                             &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        buf = new ktx_uint8_t[paddedImageDataSize];
        EXPECT_EQ(ktxTexture_LoadImageData(texture, buf, paddedImageDataSize),
                  KTX_SUCCESS);
        EXPECT_EQ(paddedImageDataSize, ktxTexture_GetDataSize(texture));
        EXPECT_EQ(helper.compareTexture1Images(buf), true);
        if (texture)
            ktxTexture_Destroy(texture);
        delete[] buf;
    }
}